

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

void libsgp4::SGP4::DeepSpaceSecular
               (double tsince,OrbitalElements *elements,CommonConstants *c_constants,
               DeepSpaceConstants *ds_constants,IntegratorParams *integ_params,double *xll,
               double *omgasm,double *xnodes,double *em,double *xinc,double *xn)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double __x;
  double dVar29;
  double __x_00;
  double __x_01;
  double dVar30;
  double dVar31;
  double dVar32;
  double dStack_180;
  double local_178;
  undefined8 uStack_170;
  double dStack_150;
  double dStack_140;
  
  *xll = ds_constants->ssl * tsince + *xll;
  *omgasm = ds_constants->ssg * tsince + *omgasm;
  *xnodes = ds_constants->ssh * tsince + *xnodes;
  *em = ds_constants->sse * tsince + *em;
  *xinc = ds_constants->ssi * tsince + *xinc;
  if (ds_constants->shape != NONE) {
    if (((ABS(tsince) < 720.0) || (integ_params->atime * tsince <= 0.0)) ||
       (ABS(tsince) < ABS(integ_params->atime))) {
      integ_params->atime = 0.0;
      integ_params->xni = elements->recovered_mean_motion_;
      integ_params->xli = ds_constants->xlamo;
    }
    while( true ) {
      if (ds_constants->shape == SYNCHRONOUS) {
        dVar1 = ds_constants->del1;
        dVar9 = sin(integ_params->xli + -0.13130908);
        dVar31 = integ_params->xli + -2.8843198;
        dVar30 = ds_constants->del2;
        dVar10 = sin(dVar31 + dVar31);
        dVar31 = ds_constants->del3;
        dVar11 = sin((integ_params->xli + -0.37448087) * 3.0);
        dVar2 = ds_constants->del1;
        dVar32 = cos(integ_params->xli + -0.13130908);
        dVar12 = ds_constants->del2 + ds_constants->del2;
        auVar3._8_4_ = SUB84(dVar30,0);
        auVar3._0_8_ = dVar12;
        auVar3._12_4_ = (int)((ulong)dVar30 >> 0x20);
        dVar30 = integ_params->xli + -2.8843198;
        dVar30 = cos(dVar30 + dVar30);
        dStack_140 = auVar3._8_8_;
        dVar13 = ds_constants->del3 * 3.0;
        auVar4._8_4_ = SUB84(dVar31,0);
        auVar4._0_8_ = dVar13;
        auVar4._12_4_ = (int)((ulong)dVar31 >> 0x20);
        dVar31 = cos((integ_params->xli + -0.37448087) * 3.0);
        dStack_150 = auVar4._8_8_;
        dVar32 = dVar31 * dVar13 + dVar32 * dVar2 + dVar30 * dVar12;
        dStack_180 = dVar11 * dStack_150 + dVar9 * dVar1 + dVar10 * dStack_140;
      }
      else {
        dVar14 = c_constants->omgdot * integ_params->atime + elements->argument_perigee_;
        dVar28 = dVar14 + dVar14;
        dVar1 = integ_params->xli;
        dVar29 = dVar1 + dVar1;
        dVar30 = ds_constants->d2201;
        dVar15 = sin(dVar1 + dVar28 + -5.7686396);
        dVar1 = ds_constants->d2211;
        dVar16 = sin(integ_params->xli + -5.7686396);
        dVar31 = ds_constants->d3210;
        dVar17 = sin(integ_params->xli + dVar14 + -0.95240898);
        dVar9 = ds_constants->d3222;
        dVar18 = sin((integ_params->xli - dVar14) + -0.95240898);
        __x = dVar28 + dVar29 + -1.8014998;
        dVar10 = ds_constants->d4410;
        dVar19 = sin(__x);
        dVar32 = ds_constants->d4422;
        dVar20 = sin(dVar29 + -1.8014998);
        dVar11 = ds_constants->d5220;
        dVar21 = sin(integ_params->xli + dVar14 + -1.050833);
        __x_01 = dVar14 + dVar29 + -4.4108898;
        __x_00 = (dVar29 - dVar14) + -4.4108898;
        dVar12 = ds_constants->d5232;
        dVar22 = sin((integ_params->xli - dVar14) + -1.050833);
        dVar13 = ds_constants->d5421;
        dVar23 = sin(__x_01);
        dVar2 = ds_constants->d5433;
        dVar24 = sin(__x_00);
        dVar27 = ds_constants->d2201;
        dVar25 = cos(dVar28 + integ_params->xli + -5.7686396);
        dVar28 = ds_constants->d2211;
        dVar26 = cos(integ_params->xli + -5.7686396);
        local_178 = ds_constants->d3210;
        uStack_170._0_4_ = SUB84(dVar32,0);
        uStack_170._4_4_ = (int)((ulong)dVar32 >> 0x20);
        dVar32 = cos(integ_params->xli + dVar14 + -0.95240898);
        dVar32 = dVar32 * local_178 + dVar25 * dVar27 + dVar26 * dVar28;
        dVar1 = dVar20 * uStack_170 +
                dVar19 * dVar10 +
                dVar18 * dVar9 + dVar17 * dVar31 + dVar15 * dVar30 + dVar16 * dVar1;
        auVar5._8_4_ = SUB84(dVar1,0);
        auVar5._0_8_ = dVar32;
        auVar5._12_4_ = (int)((ulong)dVar1 >> 0x20);
        local_178 = ds_constants->d3222;
        uStack_170._0_4_ = SUB84(dVar11,0);
        uStack_170._4_4_ = (int)((ulong)dVar11 >> 0x20);
        dVar1 = cos((integ_params->xli - dVar14) + -0.95240898);
        dVar32 = dVar1 * local_178 + dVar32;
        dStack_180 = auVar5._8_8_;
        dStack_180 = dVar21 * uStack_170 + dStack_180;
        auVar6._8_4_ = SUB84(dStack_180,0);
        auVar6._0_8_ = dVar32;
        auVar6._12_4_ = (int)((ulong)dStack_180 >> 0x20);
        local_178 = ds_constants->d5220;
        uStack_170._0_4_ = SUB84(dVar12,0);
        uStack_170._4_4_ = (int)((ulong)dVar12 >> 0x20);
        dVar1 = cos(integ_params->xli + dVar14 + -1.050833);
        dVar32 = dVar1 * local_178 + dVar32;
        dStack_180 = auVar6._8_8_;
        dStack_180 = dVar22 * uStack_170 + dStack_180;
        auVar7._8_4_ = SUB84(dStack_180,0);
        auVar7._0_8_ = dVar32;
        auVar7._12_4_ = (int)((ulong)dStack_180 >> 0x20);
        local_178 = ds_constants->d5232;
        uStack_170._0_4_ = SUB84(dVar13,0);
        uStack_170._4_4_ = (int)((ulong)dVar13 >> 0x20);
        dVar1 = cos((integ_params->xli - dVar14) + -1.050833);
        dVar32 = dVar1 * local_178 + dVar32;
        dStack_180 = auVar7._8_8_;
        dStack_180 = dVar23 * uStack_170 + dStack_180;
        auVar8._8_4_ = SUB84(dStack_180,0);
        auVar8._0_8_ = dVar32;
        auVar8._12_4_ = (int)((ulong)dStack_180 >> 0x20);
        dVar1 = ds_constants->d4410;
        dVar10 = cos(__x);
        dVar30 = ds_constants->d4422;
        dVar11 = cos(dVar29 + -1.8014998);
        dVar31 = ds_constants->d5421;
        dVar12 = cos(__x_01);
        dVar9 = ds_constants->d5433;
        dVar13 = cos(__x_00);
        dVar32 = (dVar13 * dVar9 + dVar12 * dVar31 + dVar10 * dVar1 + dVar11 * dVar30) * 2.0 +
                 dVar32;
        dStack_180 = auVar8._8_8_;
        dStack_180 = dVar24 * dVar2 + dStack_180;
      }
      dVar1 = integ_params->xni;
      dVar31 = ds_constants->xfact + dVar1;
      dVar30 = tsince - integ_params->atime;
      if (ABS(dVar30) < 720.0) break;
      dVar30 = *(double *)(&DAT_0010bf50 + (ulong)(0.0 <= dVar30) * 8);
      integ_params->xli = dStack_180 * 259200.0 + integ_params->xli + dVar30 * dVar31;
      integ_params->xni = dVar32 * dVar31 * 259200.0 + dVar1 + dVar30 * dStack_180;
      integ_params->atime = integ_params->atime + dVar30;
    }
    *xn = dVar32 * dVar31 * dVar30 * dVar30 * 0.5 + dVar1 + dStack_180 * dVar30;
    dVar1 = tsince * 0.0043752690880113 + ds_constants->gsto;
    dVar31 = dStack_180 * dVar30 * dVar30 * 0.5 + dVar31 * dVar30 + integ_params->xli;
    dVar30 = floor(dVar1 / 6.283185307179586);
    dVar1 = dVar30 * -6.283185307179586 + dVar1;
    if (ds_constants->shape == SYNCHRONOUS) {
      dVar31 = ((dVar31 + dVar1) - *xnodes) - *omgasm;
    }
    else {
      dVar1 = dVar1 - *xnodes;
      dVar31 = dVar31 + dVar1 + dVar1;
    }
    *xll = dVar31;
  }
  return;
}

Assistant:

void SGP4::DeepSpaceSecular(
        const double tsince,
        const OrbitalElements& elements,
        const CommonConstants& c_constants,
        const DeepSpaceConstants& ds_constants,
        IntegratorParams& integ_params,
        double& xll,
        double& omgasm,
        double& xnodes,
        double& em,
        double& xinc,
        double& xn)
{
    static const double G22 = 5.7686396;
    static const double G32 = 0.95240898;
    static const double G44 = 1.8014998;
    static const double G52 = 1.0508330;
    static const double G54 = 4.4108898;
    static const double FASX2 = 0.13130908;
    static const double FASX4 = 2.8843198;
    static const double FASX6 = 0.37448087;

    static const double STEP = 720.0;
    static const double STEP2 = 259200.0;

    xll += ds_constants.ssl * tsince;
    omgasm += ds_constants.ssg * tsince;
    xnodes += ds_constants.ssh * tsince;
    em += ds_constants.sse * tsince;
    xinc += ds_constants.ssi * tsince;

    if (ds_constants.shape != DeepSpaceConstants::NONE)
    {
        double xndot = 0.0;
        double xnddt = 0.0;
        double xldot = 0.0;
        /*
         * 1st condition (if tsince is less than one time step from epoch)
         * 2nd condition (if atime and
         *     tsince are of opposite signs, so zero crossing required)
         * 3rd condition (if tsince is closer to zero than 
         *     atime, only integrate away from zero)
         */
        if (fabs(tsince) < STEP ||
            tsince * integ_params.atime <= 0.0 ||
            fabs(tsince) < fabs(integ_params.atime))
        {
            // restart back at the epoch
            integ_params.atime = 0.0;
            // TODO: check
            integ_params.xni = elements.RecoveredMeanMotion();
            // TODO: check
            integ_params.xli = ds_constants.xlamo;
        }

        bool running = true;
        while (running)
        {
            // always calculate dot terms ready for integration beginning
            // from the start of the range which is 'atime'
            if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
            {
                xndot = ds_constants.del1 * sin(integ_params.xli - FASX2)
                    + ds_constants.del2 * sin(2.0 * (integ_params.xli - FASX4))
                    + ds_constants.del3 * sin(3.0 * (integ_params.xli - FASX6));
                xnddt = ds_constants.del1 * cos(integ_params.xli - FASX2)
                    + 2.0 * ds_constants.del2 * cos(2.0 * (integ_params.xli - FASX4))
                    + 3.0 * ds_constants.del3 * cos(3.0 * (integ_params.xli - FASX6));
            }
            else
            {
                // TODO: check
                const double xomi = elements.ArgumentPerigee() + c_constants.omgdot * integ_params.atime;
                const double x2omi = xomi + xomi;
                const double x2li = integ_params.xli + integ_params.xli;
                xndot = ds_constants.d2201 * sin(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * sin(integ_params.xli - G22)
                    + ds_constants.d3210 * sin(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * sin(-xomi + integ_params.xli - G32)
                    + ds_constants.d4410 * sin(x2omi + x2li - G44)
                    + ds_constants.d4422 * sin(x2li - G44)
                    + ds_constants.d5220 * sin(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * sin(-xomi + integ_params.xli - G52)
                    + ds_constants.d5421 * sin(xomi + x2li - G54)
                    + ds_constants.d5433 * sin(-xomi + x2li - G54);
                xnddt = ds_constants.d2201 * cos(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * cos(integ_params.xli - G22)
                    + ds_constants.d3210 * cos(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * cos(-xomi + integ_params.xli - G32)
                    + ds_constants.d5220 * cos(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * cos(-xomi + integ_params.xli - G52)
                    + 2.0 * (ds_constants.d4410 * cos(x2omi + x2li - G44)
                    + ds_constants.d4422 * cos(x2li - G44)
                    + ds_constants.d5421 * cos(xomi + x2li - G54)
                    + ds_constants.d5433 * cos(-xomi + x2li - G54));
            }
            xldot = integ_params.xni + ds_constants.xfact;
            xnddt *= xldot;

            double ft = tsince - integ_params.atime;
            if (fabs(ft) >= STEP)
            {
                const double delt = (ft >= 0.0 ? STEP : -STEP);
                // integrate by a full step ('delt'), updating the cached
                // values for the new 'atime'
                integ_params.xli = integ_params.xli + xldot * delt + xndot * STEP2;
                integ_params.xni = integ_params.xni + xndot * delt + xnddt * STEP2;
                integ_params.atime += delt;
            }
            else
            {
                // integrate by the difference 'ft' remaining
                xn = integ_params.xni + xndot * ft
                    + xnddt * ft * ft * 0.5;
                const double xl_temp = integ_params.xli + xldot * ft
                    + xndot * ft * ft * 0.5;

                const double theta = Util::WrapTwoPI(ds_constants.gsto + tsince * kTHDT);
                if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
                {
                    xll = xl_temp + theta - xnodes - omgasm;
                }
                else
                {
                    xll = xl_temp + 2.0 * (theta - xnodes);
                }
                running = false;
            }
        }
    }
}